

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O3

bool curl_perform_with_retry(string *url,CURL *curl,int max_attempts,int retry_delay_seconds)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  common_log *pcVar4;
  undefined8 uVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  timespec local_40;
  
  uVar8 = 3;
  do {
    if (-1 < common_log_verbosity_thold) {
      pcVar4 = common_log_main();
      common_log_add(pcVar4,GGML_LOG_LEVEL_INFO,
                     "%s: Trying to download from %s (attempt %d of %d)...\n",
                     "curl_perform_with_retry",(url->_M_dataplus)._M_p,(ulong)(4 - uVar8),3);
    }
    iVar2 = curl_easy_perform(curl);
    if (iVar2 == 0) goto LAB_00161785;
    dVar9 = ldexp(1.0,3 - uVar8);
    uVar7 = (uint)(dVar9 * 1000.0);
    if (-1 < common_log_verbosity_thold) {
      pcVar4 = common_log_main();
      uVar5 = curl_easy_strerror(iVar2);
      common_log_add(pcVar4,GGML_LOG_LEVEL_WARN,
                     "%s: curl_easy_perform() failed: %s, retrying after %d milliseconds...\n",
                     "curl_perform_with_retry",uVar5,(ulong)uVar7);
    }
    if (0 < (int)uVar7) {
      local_40.tv_sec = (ulong)uVar7 / 1000;
      local_40.tv_nsec = ((ulong)uVar7 % 1000) * 1000000;
      do {
        iVar3 = nanosleep(&local_40,&local_40);
        if (iVar3 != -1) break;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
    }
    bVar1 = 1 < uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar1);
  if (-1 < common_log_verbosity_thold) {
    pcVar4 = common_log_main();
    common_log_add(pcVar4,GGML_LOG_LEVEL_ERROR,"%s: curl_easy_perform() failed after %d attempts\n",
                   "curl_perform_with_retry",3);
  }
LAB_00161785:
  return iVar2 == 0;
}

Assistant:

static bool curl_perform_with_retry(const std::string & url, CURL * curl, int max_attempts, int retry_delay_seconds) {
    int remaining_attempts = max_attempts;

    while (remaining_attempts > 0) {
        LOG_INF("%s: Trying to download from %s (attempt %d of %d)...\n", __func__ , url.c_str(), max_attempts - remaining_attempts + 1, max_attempts);

        CURLcode res = curl_easy_perform(curl);
        if (res == CURLE_OK) {
            return true;
        }

        int exponential_backoff_delay = std::pow(retry_delay_seconds, max_attempts - remaining_attempts) * 1000;
        LOG_WRN("%s: curl_easy_perform() failed: %s, retrying after %d milliseconds...\n", __func__, curl_easy_strerror(res), exponential_backoff_delay);

        remaining_attempts--;
        std::this_thread::sleep_for(std::chrono::milliseconds(exponential_backoff_delay));
    }

    LOG_ERR("%s: curl_easy_perform() failed after %d attempts\n", __func__, max_attempts);

    return false;
}